

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyRemoveNode(Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = node->prev;
  pNVar2 = node->next;
  if (pNVar1 != (Node *)0x0) {
    pNVar1->next = pNVar2;
  }
  if (pNVar2 != (Node *)0x0) {
    pNVar2->prev = pNVar1;
  }
  pNVar1 = node->parent;
  if (pNVar1 != (Node *)0x0) {
    if (pNVar1->content == node) {
      pNVar1->content = pNVar2;
    }
    if (pNVar1->last == node) {
      pNVar1->last = node->prev;
    }
  }
  node->parent = (Node *)0x0;
  node->prev = (Node *)0x0;
  node->next = (Node *)0x0;
  return node;
}

Assistant:

Node *TY_(RemoveNode)(Node *node)
{
    if (node->prev)
        node->prev->next = node->next;

    if (node->next)
        node->next->prev = node->prev;

    if (node->parent)
    {
        if (node->parent->content == node)
            node->parent->content = node->next;

        if (node->parent->last == node)
            node->parent->last = node->prev;
    }

    node->parent = node->prev = node->next = NULL;
    return node;
}